

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warehouseapp.cpp
# Opt level: O0

bool __thiscall WarehouseServer::AddProduct(WarehouseServer *this,Product *p)

{
  Product *pPVar1;
  bool bVar2;
  mapped_type *this_00;
  _Self local_30;
  _Self local_28;
  Product *local_20;
  Product *p_local;
  WarehouseServer *this_local;
  
  local_20 = p;
  p_local = (Product *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>_>
       ::find(&this->products,&p->id);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>_>
       ::end(&this->products);
  bVar2 = std::operator!=(&local_28,&local_30);
  pPVar1 = local_20;
  if (!bVar2) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Product>_>_>
              ::operator[](&this->products,&local_20->id);
    Product::operator=(this_00,pPVar1);
  }
  this_local._7_1_ = !bVar2;
  return this_local._7_1_;
}

Assistant:

bool WarehouseServer::AddProduct(const Product &p) {
  if (products.find(p.id) != products.end())
    return false;
  products[p.id] = p;
  return true;
}